

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_transaction.cpp
# Opt level: O2

ByteData *
cfd::core::ConvertBitcoinTxFromWally
          (ByteData *__return_storage_ptr__,wally_tx *tx,bool force_exclude_witness)

{
  wally_tx_witness_stack *pwVar1;
  wally_tx_output *pwVar2;
  wally_tx_witness_item *pwVar3;
  CfdException *pCVar4;
  uint uVar5;
  ulong uVar6;
  byte bVar7;
  uint32_t initial_size;
  long lVar8;
  size_t sVar9;
  uint uVar10;
  uint64_t value;
  wally_tx_input *pwVar11;
  int ret;
  allocator local_91;
  Serializer builder;
  size_t size;
  size_t tx_size;
  vector<unsigned_char,_std::allocator<unsigned_char>_> buf;
  size_t witness_count;
  
  witness_count = 0;
  ret = wally_tx_get_witness_count(tx,&witness_count);
  if (ret != 0) {
    builder._vptr_Serializer = (_func_int **)0x4b0f2b;
    builder.buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = 0x3ca;
    builder.buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = "ConvertBitcoinTxFromWally";
    logger::warn<int&>((CfdSourceLocation *)&builder,"wally_tx_get_witness_count NG[{}]",&ret);
    pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::__cxx11::string::string
              ((string *)&builder,"psbt witness count get error.",(allocator *)&buf);
    CfdException::CfdException(pCVar4,kCfdIllegalStateError,(string *)&builder);
    __cxa_throw(pCVar4,&CfdException::typeinfo,CfdException::~CfdException);
  }
  bVar7 = ~force_exclude_witness & witness_count != 0;
  size = 0;
  ret = wally_tx_get_length(tx,(uint)bVar7,&size);
  if (ret != 0) {
    builder._vptr_Serializer = (_func_int **)0x4b0f2b;
    builder.buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = 0x3d4;
    builder.buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = "ConvertBitcoinTxFromWally";
    logger::warn<int&>((CfdSourceLocation *)&builder,"wally_tx_get_length NG[{}]",&ret);
    pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::__cxx11::string::string((string *)&builder,"psbt tx size get error.",(allocator *)&buf);
    CfdException::CfdException(pCVar4,kCfdIllegalStateError,(string *)&builder);
    __cxa_throw(pCVar4,&CfdException::typeinfo,CfdException::~CfdException);
  }
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&buf,size,(allocator_type *)&builder);
  tx_size = 0;
  if (size < 0x14) {
    ret = -2;
  }
  else {
    ret = wally_tx_to_bytes(tx,(uint)bVar7,
                            buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)buf.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                            (long)buf.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start,&tx_size);
    if (ret != -2) {
      if (ret != 0) {
        builder._vptr_Serializer = (_func_int **)0x4b0f2b;
        builder.buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start._0_4_ = 0x437;
        builder.buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = "ConvertBitcoinTxFromWally";
        logger::warn<int&>((CfdSourceLocation *)&builder,"wally_tx_to_bytes NG[{}].",&ret);
        pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
        ::std::__cxx11::string::string((string *)&builder,"psbt tx hex convert error.",&local_91);
        CfdException::CfdException(pCVar4,kCfdIllegalStateError,(string *)&builder);
        __cxa_throw(pCVar4,&CfdException::typeinfo,CfdException::~CfdException);
      }
      ByteData::ByteData(__return_storage_ptr__,
                         buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_start,(uint32_t)tx_size);
      goto LAB_003722be;
    }
  }
  if ((tx->num_inputs != 0) && (tx->num_outputs != 0)) {
    builder._vptr_Serializer = (_func_int **)0x4b0f2b;
    builder.buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = 0x433;
    builder.buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = "ConvertBitcoinTxFromWally";
    logger::warn<int&>((CfdSourceLocation *)&builder,"wally_tx_to_bytes NG[{}].",&ret);
    pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::__cxx11::string::string((string *)&builder,"tx hex convert error.",&local_91);
    CfdException::CfdException(pCVar4,kCfdIllegalStateError,(string *)&builder);
    __cxa_throw(pCVar4,&CfdException::typeinfo,CfdException::~CfdException);
  }
  builder._vptr_Serializer = (_func_int **)0x4b0f2b;
  builder.buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x3eb;
  builder.buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = "ConvertBitcoinTxFromWally";
  logger::info<unsigned_long&>((CfdSourceLocation *)&builder,"wally_tx_get_length size[{}]",&size);
  uVar6 = tx->num_inputs;
  lVar8 = tx->num_outputs * 0x70 + uVar6 * 0xd0 + 0x38;
  for (uVar5 = 0; uVar5 < uVar6; uVar5 = uVar5 + 1) {
    lVar8 = lVar8 + tx->inputs[uVar5].script_len + 10;
  }
  uVar5 = 0;
  while( true ) {
    initial_size = (uint32_t)lVar8;
    if (tx->num_outputs <= (ulong)uVar5) break;
    lVar8 = lVar8 + tx->outputs[uVar5].script_len + 10;
    uVar5 = uVar5 + 1;
  }
  if (bVar7 != 0) {
    uVar5 = 0;
    while( true ) {
      initial_size = (uint32_t)lVar8;
      if (uVar6 <= uVar5) break;
      pwVar1 = tx->inputs[uVar5].witness;
      if (pwVar1 == (wally_tx_witness_stack *)0x0) {
        sVar9 = 0;
      }
      else {
        sVar9 = pwVar1->num_items;
      }
      for (uVar10 = 0; uVar10 < sVar9; uVar10 = uVar10 + 1) {
        lVar8 = lVar8 + pwVar1->items[uVar10].witness_len + 10;
      }
      lVar8 = lVar8 + 10;
      uVar5 = uVar5 + 1;
    }
  }
  Serializer::Serializer(&builder,initial_size);
  Serializer::AddDirectNumber(&builder,tx->version);
  sVar9 = tx->num_inputs;
  if (bVar7 != 0) {
    if (sVar9 == 0) {
      sVar9 = 0;
    }
    else {
      Serializer::AddDirectByte(&builder,'\0');
      Serializer::AddDirectByte(&builder,'\x01');
      sVar9 = tx->num_inputs;
    }
  }
  Serializer::AddVariableInt(&builder,sVar9);
  for (uVar5 = 0; (ulong)uVar5 < tx->num_inputs; uVar5 = uVar5 + 1) {
    pwVar11 = tx->inputs + uVar5;
    Serializer::AddDirectBytes(&builder,pwVar11->txhash,0x20);
    Serializer::AddDirectNumber(&builder,pwVar11->index);
    Serializer::AddVariableBuffer(&builder,pwVar11->script,(uint32_t)pwVar11->script_len);
    Serializer::AddDirectNumber(&builder,pwVar11->sequence);
  }
  Serializer::AddVariableInt(&builder,tx->num_outputs);
  for (uVar5 = 0; uVar6 = (ulong)uVar5, uVar6 < tx->num_outputs; uVar5 = uVar5 + 1) {
    pwVar2 = tx->outputs;
    Serializer::AddDirectNumber(&builder,pwVar2[uVar6].satoshi);
    Serializer::AddVariableBuffer(&builder,pwVar2[uVar6].script,(uint32_t)pwVar2[uVar6].script_len);
  }
  if (bVar7 != 0) {
    for (uVar5 = 0; uVar6 = (ulong)uVar5, uVar6 < tx->num_inputs; uVar5 = uVar5 + 1) {
      pwVar11 = tx->inputs;
      pwVar1 = pwVar11[uVar6].witness;
      if (pwVar1 == (wally_tx_witness_stack *)0x0) {
        value = 0;
      }
      else {
        value = (uint64_t)(uint)pwVar1->num_items;
      }
      Serializer::AddVariableInt(&builder,value);
      for (lVar8 = 0; value * 0x10 != lVar8; lVar8 = lVar8 + 0x10) {
        pwVar3 = (pwVar11[uVar6].witness)->items;
        Serializer::AddVariableBuffer
                  (&builder,*(uint8_t **)((long)&pwVar3->witness + lVar8),
                   *(uint32_t *)((long)&pwVar3->witness_len + lVar8));
      }
    }
  }
  Serializer::AddDirectNumber(&builder,tx->locktime);
  Serializer::Output(__return_storage_ptr__,&builder);
  Serializer::~Serializer(&builder);
LAB_003722be:
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  return __return_storage_ptr__;
}

Assistant:

ByteData ConvertBitcoinTxFromWally(
    const struct wally_tx *tx, bool force_exclude_witness) {
  int ret;
  size_t witness_count = 0;
  ret = wally_tx_get_witness_count(tx, &witness_count);
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "wally_tx_get_witness_count NG[{}]", ret);
    throw CfdException(kCfdIllegalStateError, "psbt witness count get error.");
  }

  uint32_t flags = (witness_count != 0) ? WALLY_TX_FLAG_USE_WITNESS : 0;
  if (force_exclude_witness) flags = 0;

  size_t size = 0;
  ret = wally_tx_get_length(tx, flags, &size);
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "wally_tx_get_length NG[{}]", ret);
    throw CfdException(kCfdIllegalStateError, "psbt tx size get error.");
  }

  try {
    std::vector<uint8_t> buf(size);
    size_t tx_size = 0;

    if (size < kTransactionMinimumHexSize) {
      ret = WALLY_EINVAL;
    } else {
      ret = wally_tx_to_bytes(tx, flags, buf.data(), buf.size(), &tx_size);
    }

    if (ret == WALLY_OK) {
      return ByteData(buf.data(), static_cast<uint32_t>(tx_size));
    } else if (ret == WALLY_EINVAL) {
      /* TODO: About conversion to the object.
      * In libwally, txin / txout does not allow empty data.
      * Therefore, if txin / txout is empty, object to byte is an error.
      * Therefore, it performs its own processing under certain circumstances.
      */
      if ((tx->num_inputs == 0) || (tx->num_outputs == 0)) {
        info(CFD_LOG_SOURCE, "wally_tx_get_length size[{}]", size);
        // Necessary size calculation because wally_tx_get_length may be
        // an invalid value (reserved more)
        size_t need_size = sizeof(struct wally_tx);
        need_size += tx->num_inputs * sizeof(struct wally_tx_input);
        need_size += tx->num_outputs * sizeof(struct wally_tx_output);
        for (uint32_t i = 0; i < tx->num_inputs; ++i) {
          const struct wally_tx_input *input = tx->inputs + i;
          need_size += input->script_len + 10;
        }
        for (uint32_t i = 0; i < tx->num_outputs; ++i) {
          const struct wally_tx_output *output = tx->outputs + i;
          need_size += output->script_len + 10;
        }
        if (flags != 0) {
          for (uint32_t i = 0; i < tx->num_inputs; ++i) {
            const struct wally_tx_input *input = tx->inputs + i;
            size_t num_items = input->witness ? input->witness->num_items : 0;
            for (uint32_t j = 0; j < num_items; ++j) {
              const struct wally_tx_witness_item *stack;
              stack = input->witness->items + j;
              need_size += stack->witness_len + 10;
            }
            need_size += 10;
          }
        }

        Serializer builder(static_cast<uint32_t>(need_size));
        builder.AddDirectNumber(tx->version);
        if ((flags != 0) && (tx->num_inputs != 0)) {  // witness
          builder.AddDirectByte(0);                   // marker is 0
          builder.AddDirectByte(1);                   // flag is 1(witness)
        }

        builder.AddVariableInt(tx->num_inputs);
        for (uint32_t i = 0; i < tx->num_inputs; ++i) {
          const struct wally_tx_input *input = tx->inputs + i;
          builder.AddDirectBytes(input->txhash, sizeof(input->txhash));
          builder.AddDirectNumber(input->index);
          builder.AddVariableBuffer(
              input->script, static_cast<uint32_t>(input->script_len));
          builder.AddDirectNumber(input->sequence);
        }

        builder.AddVariableInt(tx->num_outputs);
        for (uint32_t i = 0; i < tx->num_outputs; ++i) {
          const struct wally_tx_output *output = tx->outputs + i;
          builder.AddDirectNumber(output->satoshi);
          builder.AddVariableBuffer(
              output->script, static_cast<uint32_t>(output->script_len));
        }

        if (flags != 0) {  // witness
          for (uint32_t i = 0; i < tx->num_inputs; ++i) {
            const struct wally_tx_input *input = tx->inputs + i;
            uint32_t num_items =
                input->witness
                    ? static_cast<uint32_t>(input->witness->num_items)
                    : 0;
            builder.AddVariableInt(num_items);
            for (uint32_t j = 0; j < num_items; ++j) {
              const struct wally_tx_witness_item *stack;
              stack = input->witness->items + j;
              builder.AddVariableBuffer(
                  stack->witness, static_cast<uint32_t>(stack->witness_len));
            }
          }
        }

        builder.AddDirectNumber(tx->locktime);
        return builder.Output();
      } else {
        warn(CFD_LOG_SOURCE, "wally_tx_to_bytes NG[{}].", ret);
        throw CfdException(kCfdIllegalStateError, "tx hex convert error.");
      }
    } else {
      warn(CFD_LOG_SOURCE, "wally_tx_to_bytes NG[{}].", ret);
      throw CfdException(kCfdIllegalStateError, "psbt tx hex convert error.");
    }
  } catch (const CfdError &except) {
    throw except;
  } catch (const std::exception &except) {
    warn(CFD_LOG_SOURCE, "unknown exception.");
    throw CfdException(kCfdUnknownError, std::string(except.what()));
  } catch (...) {
    warn(CFD_LOG_SOURCE, "unknown error.");
    throw CfdException();
  }
}